

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrPrintMatrixStats(Llb_Mtr_t *p)

{
  void *__ptr;
  void *__ptr_00;
  int *pGrp2;
  int *pGrp1;
  uint local_28;
  int nCutSizeMax;
  int nCutSize;
  int Span;
  int iGrp2;
  int iGrp1;
  int iGrp;
  int iVar;
  Llb_Mtr_t *p_local;
  
  nCutSizeMax = 0;
  local_28 = 0;
  pGrp1._4_4_ = 0;
  __ptr = calloc((long)p->nRows,4);
  __ptr_00 = calloc((long)p->nRows,4);
  iGrp1 = 0;
  do {
    if (p->nRows <= iGrp1) {
      for (iGrp2 = 0; iGrp2 < p->nCols; iGrp2 = iGrp2 + 1) {
        for (iGrp1 = 0; iGrp1 < p->nRows; iGrp1 = iGrp1 + 1) {
          if (*(int *)((long)__ptr + (long)iGrp1 * 4) == iGrp2) {
            local_28 = local_28 + 1;
          }
        }
        if ((int)pGrp1._4_4_ < (int)local_28) {
          pGrp1._4_4_ = local_28;
        }
        for (iGrp1 = 0; iGrp1 < p->nRows; iGrp1 = iGrp1 + 1) {
          if (*(int *)((long)__ptr_00 + (long)iGrp1 * 4) == iGrp2) {
            local_28 = local_28 - 1;
          }
        }
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      printf("[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n",
             ((double)nCutSizeMax * 1.0) / (double)p->nRows,(ulong)(uint)p->nCols,
             (ulong)(uint)p->nRows,(ulong)pGrp1._4_4_);
      if (local_28 != 0) {
        Abc_Print(-1,"Cut size is not zero (%d).\n",(ulong)local_28);
      }
      return;
    }
    if (p->pRowSums[iGrp1] != 0) {
      Span = 0;
      while ((Span < p->nCols && (p->pMatrix[Span][iGrp1] != '\x01'))) {
        Span = Span + 1;
      }
      nCutSize = p->nCols;
      do {
        nCutSize = nCutSize + -1;
        if (nCutSize < 0) break;
      } while (p->pMatrix[nCutSize][iGrp1] != '\x01');
      if (nCutSize < Span) {
        __assert_fail("iGrp1 <= iGrp2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Matrix.c"
                      ,0xfb,"void Llb_MtrPrintMatrixStats(Llb_Mtr_t *)");
      }
      *(int *)((long)__ptr + (long)iGrp1 * 4) = Span;
      *(int *)((long)__ptr_00 + (long)iGrp1 * 4) = nCutSize;
      nCutSizeMax = (nCutSize - Span) + nCutSizeMax;
    }
    iGrp1 = iGrp1 + 1;
  } while( true );
}

Assistant:

void Llb_MtrPrintMatrixStats( Llb_Mtr_t * p )
{
    int iVar, iGrp, iGrp1, iGrp2, Span = 0, nCutSize = 0, nCutSizeMax = 0;
    int * pGrp1 = ABC_CALLOC( int, p->nRows ); 
    int * pGrp2 = ABC_CALLOC( int, p->nRows ); 
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pRowSums[iVar] == 0 )
            continue;
        for ( iGrp1 = 0; iGrp1 < p->nCols; iGrp1++ )
            if ( p->pMatrix[iGrp1][iVar] == 1 )
                break;
        for ( iGrp2 = p->nCols - 1; iGrp2 >= 0; iGrp2-- )
            if ( p->pMatrix[iGrp2][iVar] == 1 )
                break;
        assert( iGrp1 <= iGrp2 );
        pGrp1[iVar] = iGrp1;
        pGrp2[iVar] = iGrp2;
        Span += iGrp2 - iGrp1;
    }
    // compute span
    for ( iGrp = 0; iGrp < p->nCols; iGrp++ )
    {
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp1[iVar] == iGrp )
                nCutSize++;
        if ( nCutSizeMax < nCutSize )
            nCutSizeMax = nCutSize;
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp2[iVar] == iGrp )
                nCutSize--;
    }
    ABC_FREE( pGrp1 );
    ABC_FREE( pGrp2 );
    printf( "[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n", 
        p->nCols, p->nRows, 1.0*Span/p->nRows, nCutSizeMax );
    if ( nCutSize )
        Abc_Print( -1, "Cut size is not zero (%d).\n", nCutSize );
}